

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall
wallet::RestoreWallet
          (wallet *this,WalletContext *context,path *backup_file,string *wallet_name,
          optional<bool> load_on_start,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar8;
  path local_1f8 [2];
  string local_198;
  long *local_178;
  long local_170;
  long local_168 [2];
  undefined1 local_158 [48];
  long local_128 [2];
  path local_118;
  path wallet_file;
  path wallet_path;
  DatabaseOptions options;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  options.require_existing = false;
  options.require_create = false;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  options.create_flags = 0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  options.create_passphrase._M_dataplus._M_p = (pointer)args;
  ReadDatabaseArgs(context->args,&options);
  options.require_existing = true;
  GetWalletDir();
  pcVar2 = (wallet_name->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_58,pcVar2,pcVar2 + wallet_name->_M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_158,&local_58,auto_format);
  std::filesystem::__cxx11::path::path(&wallet_file.super_path,(path *)local_158);
  std::filesystem::__cxx11::path::~path((path *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  fsbridge::AbsPathJoin(&wallet_path,(path *)local_1f8,&wallet_file);
  std::filesystem::__cxx11::path::~path(&wallet_file.super_path);
  std::filesystem::__cxx11::path::~path(local_1f8);
  std::filesystem::__cxx11::path::path(&local_118,&wallet_path.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_118,10,"wallet.dat");
  std::filesystem::__cxx11::path::path(&wallet_file.super_path,&local_118);
  std::filesystem::__cxx11::path::~path(&local_118);
  cVar5 = std::filesystem::status((path *)backup_file);
  if ((cVar5 == -1) || (cVar5 == '\0')) {
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Backup file does not exist","");
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_178,local_170 + (long)local_178);
    local_158._32_8_ = (_Impl *)local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_158 + 0x20),local_178,local_170 + (long)local_178);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_158 + 0x20));
    if ((_Impl *)local_158._32_8_ != (_Impl *)local_128) {
      operator_delete((void *)local_158._32_8_,local_128[0] + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    *status = FAILED_INVALID_BACKUP_FILE;
  }
  else {
    cVar5 = std::filesystem::status((path *)&wallet_path);
    if (((cVar5 == -1) || (cVar5 == '\0')) && (bVar6 = TryCreateDirectories(&wallet_path), bVar6)) {
      std::filesystem::copy_file((path *)backup_file,(path *)&wallet_file,none);
      LoadWallet((wallet *)local_158,context,wallet_name,load_on_start,&options,status,error,
                 warnings);
      uVar4 = local_158._8_8_;
      uVar3 = local_158._0_8_;
      local_158._8_8_ = 0;
      local_158._0_8_ = (pointer)0x0;
      if ((pointer)uVar3 == (pointer)0x0) {
        std::filesystem::remove_all((path *)&wallet_path);
      }
      *(undefined8 *)this = uVar3;
      *(undefined8 *)(this + 8) = uVar4;
      goto LAB_0015ba8f;
    }
    paVar1 = &local_1f8[0]._M_pathname.field_2;
    local_1f8[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,wallet_path.super_path._M_pathname._M_dataplus._M_p,
               wallet_path.super_path._M_pathname._M_dataplus._M_p +
               wallet_path.super_path._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (&local_198,
               (tinyformat *)"Failed to create database path \'%s\'. Database already exists.",
               (char *)local_1f8,args);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    local_158._32_8_ = (_Impl *)local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_158 + 0x20),local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_158 + 0x20));
    if ((_Impl *)local_158._32_8_ != (_Impl *)local_128) {
      operator_delete((void *)local_158._32_8_,local_128[0] + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8[0]._M_pathname._M_dataplus._M_p,
                      local_1f8[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    *status = FAILED_ALREADY_EXISTS;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0015ba8f:
  std::filesystem::__cxx11::path::~path(&wallet_file.super_path);
  std::filesystem::__cxx11::path::~path(&wallet_path.super_path);
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)options.create_passphrase._M_dataplus._M_p != &options.create_passphrase.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&options.create_passphrase,
               CONCAT71(options.create_passphrase.field_2._M_allocated_capacity._1_7_,
                        options.create_passphrase.field_2._M_local_buf[0]));
    _Var7._M_pi = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  sVar8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<wallet::CWallet>)
         sVar8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> RestoreWallet(WalletContext& context, const fs::path& backup_file, const std::string& wallet_name, std::optional<bool> load_on_start, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    DatabaseOptions options;
    ReadDatabaseArgs(*context.args, options);
    options.require_existing = true;

    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::u8path(wallet_name));
    auto wallet_file = wallet_path / "wallet.dat";
    std::shared_ptr<CWallet> wallet;

    try {
        if (!fs::exists(backup_file)) {
            error = Untranslated("Backup file does not exist");
            status = DatabaseStatus::FAILED_INVALID_BACKUP_FILE;
            return nullptr;
        }

        if (fs::exists(wallet_path) || !TryCreateDirectories(wallet_path)) {
            error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(wallet_path)));
            status = DatabaseStatus::FAILED_ALREADY_EXISTS;
            return nullptr;
        }

        fs::copy_file(backup_file, wallet_file, fs::copy_options::none);

        wallet = LoadWallet(context, wallet_name, load_on_start, options, status, error, warnings);
    } catch (const std::exception& e) {
        assert(!wallet);
        if (!error.empty()) error += Untranslated("\n");
        error += strprintf(Untranslated("Unexpected exception: %s"), e.what());
    }
    if (!wallet) {
        fs::remove_all(wallet_path);
    }

    return wallet;
}